

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

int net_set_blocking(NETSOCKET sock)

{
  long in_FS_OFFSET;
  unsigned_long mode;
  undefined8 local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0;
  if (-1 < sock._0_8_) {
    ioctl(sock.ipv4sock,0x5421,&local_18);
  }
  if (-1 < sock.ipv6sock) {
    ioctl(sock.ipv6sock,0x5421,&local_18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

int net_set_blocking(NETSOCKET sock)
{
	unsigned long mode = 0;
	if(sock.ipv4sock >= 0)
	{
#if defined(CONF_FAMILY_WINDOWS)
		ioctlsocket(sock.ipv4sock, FIONBIO, (unsigned long *)&mode);
#else
		ioctl(sock.ipv4sock, FIONBIO, (unsigned long *)&mode);
#endif
	}

	if(sock.ipv6sock >= 0)
	{
#if defined(CONF_FAMILY_WINDOWS)
		ioctlsocket(sock.ipv6sock, FIONBIO, (unsigned long *)&mode);
#else
		ioctl(sock.ipv6sock, FIONBIO, (unsigned long *)&mode);
#endif
	}

	return 0;
}